

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

common_sampler * common_sampler_clone(common_sampler *gsmpl)

{
  common_sampler *pcVar1;
  llama_sampler *plVar2;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *in_RDI;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *unaff_retaddr;
  ring_buffer<int> *in_stack_ffffffffffffffa8;
  common_params_sampling *in_stack_ffffffffffffffe8;
  common_params_sampling *in_stack_fffffffffffffff0;
  
  pcVar1 = (common_sampler *)operator_new(0x1a0);
  common_params_sampling::common_params_sampling
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  plVar2 = (llama_sampler *)
           llama_sampler_clone(in_RDI[0xc].
                               super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  pcVar1->grmr = plVar2;
  plVar2 = (llama_sampler *)
           llama_sampler_clone(in_RDI[0xc].
                               super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  pcVar1->chain = plVar2;
  ring_buffer<int>::ring_buffer(&pcVar1->prev,in_stack_ffffffffffffffa8);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector(unaff_retaddr,in_RDI);
  (pcVar1->cur_p).data =
       in_RDI[0x10].super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pcVar1->cur_p).size =
       (size_t)in_RDI[0x10].super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  (pcVar1->cur_p).selected =
       (int64_t)in_RDI[0x10].super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(pointer *)&(pcVar1->cur_p).sorted =
       in_RDI[0x11].super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
       super__Vector_impl_data._M_start;
  return pcVar1;
}

Assistant:

struct common_sampler * common_sampler_clone(common_sampler * gsmpl) {
    return new common_sampler {
        /* .params = */ gsmpl->params,
        /* .grmr   = */ llama_sampler_clone(gsmpl->grmr),
        /* .chain  = */ llama_sampler_clone(gsmpl->chain),
        /* .prev   = */ gsmpl->prev,
        /* .cur    = */ gsmpl->cur,
        /* .cur_p  = */ gsmpl->cur_p,
    };
}